

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::null_scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  ulong uVar1;
  pointer __p;
  _Hash_node_base *p_Var2;
  undefined8 uVar3;
  size_t sVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
  custom_handler;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_40;
  padding_info local_38;
  pad_side local_28;
  bool bStack_24;
  bool bStack_23;
  undefined2 uStack_22;
  
  uVar3 = padding._8_8_;
  sVar4 = padding.width_;
  local_38._8_6_ = padding.width_._0_6_;
  local_38._14_2_ = padding.width_._6_2_;
  local_28 = padding.side_;
  bStack_24 = padding.truncate_;
  bStack_23 = padding.enabled_;
  uStack_22 = padding._14_2_;
  uVar1 = (this->custom_handlers_)._M_h._M_bucket_count;
  uVar5 = (ulong)(long)(int)CONCAT71(in_register_00000031,flag) % uVar1;
  p_Var6 = (this->custom_handlers_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(char *)&p_Var6->_M_nxt[1]._M_nxt != flag)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(char *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, *(char *)&p_Var2[1]._M_nxt == flag)) goto LAB_00346ae7;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00346ae7:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var7->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    (*(code *)(p_Var2[2]._M_nxt)->_M_nxt[3]._M_nxt)(&local_40);
    local_38.width_ = (size_t)local_40._M_head_impl;
    *(ulong *)((long)&((local_40._M_head_impl)->padinfo_).width_ + 6) =
         CONCAT17(bStack_23,CONCAT16(bStack_24,CONCAT42(local_28,local_38._14_2_)));
    ((local_40._M_head_impl)->padinfo_).width_ = CONCAT26(local_38._14_2_,local_38._8_6_);
    local_40._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_38);
    if ((flag_formatter *)local_38.width_ != (flag_formatter *)0x0) {
      (*(*(_func_int ***)local_38.width_)[1])();
    }
    goto LAB_00346b4d;
  }
  switch(flag) {
  case '!':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eefb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  default:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x38);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)0x0;
    ((local_40._M_head_impl)->padinfo_).width_ = 0;
    ((local_40._M_head_impl)->padinfo_).side_ = left;
    ((local_40._M_head_impl)->padinfo_).truncate_ = false;
    ((local_40._M_head_impl)->padinfo_).enabled_ = false;
    *(undefined2 *)&((local_40._M_head_impl)->padinfo_).field_0xe = 0;
    local_40._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_40._M_head_impl[1].padinfo_.width_ = 0;
    local_40._M_head_impl[1].padinfo_.side_ = left;
    local_40._M_head_impl[1].padinfo_.truncate_ = false;
    local_40._M_head_impl[1].padinfo_.enabled_ = false;
    *(undefined2 *)&local_40._M_head_impl[1].padinfo_.field_0xe = 0;
    local_40._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__aggregate_formatter_004ef0f8
    ;
    local_40._M_head_impl[1]._vptr_flag_formatter =
         (_func_int **)&local_40._M_head_impl[1].padinfo_.side_;
    local_40._M_head_impl[1].padinfo_.width_ = 0;
    *(undefined1 *)&local_40._M_head_impl[1].padinfo_.side_ = left;
    if (bStack_24 == false) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_40._M_head_impl + 1),'%');
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_40._M_head_impl + 1),flag);
      local_38.width_ = (size_t)local_40._M_head_impl;
      local_40._M_head_impl = (flag_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
    }
    else {
      bStack_24 = false;
      local_38.width_ = (size_t)operator_new(0x18);
      *(size_t *)(local_38.width_ + 8) = sVar4;
      *(long *)(local_38.width_ + 0x10) =
           CONCAT26(uStack_22,CONCAT15(bStack_23,CONCAT14(bStack_24,local_28)));
      *(undefined ***)local_38.width_ = &PTR__flag_formatter_004eefb8;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
      if ((long *)local_38.width_ != (long *)0x0) {
        (**(code **)(*(long *)local_38.width_ + 8))();
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_40._M_head_impl + 1),flag);
      local_38.width_ = (size_t)local_40._M_head_impl;
      local_40._M_head_impl = (flag_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
    }
    if ((flag_formatter *)local_38.width_ != (flag_formatter *)0x0) {
      (*(*(_func_int ***)local_38.width_)[1])();
    }
    if ((aggregate_formatter *)local_40._M_head_impl == (aggregate_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_40,
               (aggregate_formatter *)local_40._M_head_impl);
    return;
  case '#':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eef78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case '$':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee478;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case '%':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x20);
    ((local_40._M_head_impl)->padinfo_).width_ = 0;
    *(undefined8 *)((long)&((local_40._M_head_impl)->padinfo_).width_ + 6) = 0;
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee5f8;
    *(undefined1 *)&local_40._M_head_impl[1]._vptr_flag_formatter = 0x25;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case '&':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004edcb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case '+':
    std::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>(&local_38);
    local_40._M_head_impl = (flag_formatter *)local_38.width_;
    local_38.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if (local_40._M_head_impl != (flag_formatter *)0x0) {
      (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_40._M_head_impl = (flag_formatter *)0x0;
    if ((full_formatter *)local_38.width_ != (full_formatter *)0x0) {
      std::default_delete<spdlog::details::full_formatter>::operator()
                ((default_delete<spdlog::details::full_formatter> *)&local_38,
                 (full_formatter *)local_38.width_);
    }
    goto LAB_00347526;
  case '@':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeeb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'A':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee8f8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'B':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee978;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'C':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee9f8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'D':
  case 'x':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eea78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'E':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eecf8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'F':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eecb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'H':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeb38;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'I':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeb78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'L':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee7f8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'M':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eebb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'O':
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,spdlog::details::padding_info&>
              (&local_38);
    local_40._M_head_impl = (flag_formatter *)local_38.width_;
    local_38.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_003475e1;
  case 'P':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eee78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'R':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eedb8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'S':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eebf8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'T':
  case 'X':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eedf8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'Y':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eea38;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case '^':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee438;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'a':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee8b8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'b':
  case 'h':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee938;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'c':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee9b8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'd':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeaf8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'e':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eec38;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'f':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eec78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'g':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eef38;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'i':
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,spdlog::details::padding_info&>
              (&local_38);
    local_40._M_head_impl = (flag_formatter *)local_38.width_;
    local_38.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_003475e1;
  case 'l':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee7b8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'm':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeab8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'n':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee778;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'o':
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,spdlog::details::padding_info&>
              (&local_38);
    local_40._M_head_impl = (flag_formatter *)local_38.width_;
    local_38.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_003475e1;
  case 'p':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eed38;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 'r':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eed78;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 's':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eeef8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 't':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee838;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_00346b4d;
  case 'u':
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,spdlog::details::padding_info&>
              (&local_38);
    local_40._M_head_impl = (flag_formatter *)local_38.width_;
    local_38.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
LAB_003475e1:
    if (local_40._M_head_impl != (flag_formatter *)0x0) {
      (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_40._M_head_impl = (flag_formatter *)0x0;
    if ((void *)local_38.width_ == (void *)0x0) {
      return;
    }
    operator_delete((void *)local_38.width_,0x20);
    return;
  case 'v':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004ee878;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
LAB_00346b4d:
    if (local_40._M_head_impl != (flag_formatter *)0x0) {
      (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
    }
    return;
  case 'z':
    local_40._M_head_impl = (flag_formatter *)operator_new(0x28);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_004eee38;
    local_40._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    *(undefined4 *)&local_40._M_head_impl[1].padinfo_.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
  }
  if (local_40._M_head_impl != (flag_formatter *)0x0) {
    (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
  }
LAB_00347526:
  this->need_localtime_ = true;
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding) {
    // process custom flags
    auto it = custom_handlers_.find(flag);
    if (it != custom_handlers_.end()) {
        auto custom_handler = it->second->clone();
        custom_handler->set_padding_info(padding);
        formatters_.push_back(std::move(custom_handler));
        return;
    }

    // process built-in flags
    switch (flag) {
        case ('+'):  // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            need_localtime_ = true;
            break;

        case 'n':  // logger name
            formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
            break;

        case 'l':  // level
            formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
            break;

        case 'L':  // short level
            formatters_.push_back(
                details::make_unique<details::short_level_formatter<Padder>>(padding));
            break;

        case ('t'):  // thread id
            formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
            break;

        case ('v'):  // the message text
            formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
            break;

        case ('a'):  // weekday
            formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('A'):  // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('b'):
        case ('h'):  // month
            formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('B'):  // short month
            formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('c'):  // datetime
            formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('C'):  // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('Y'):  // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('D'):
        case ('x'):  // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('m'):  // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('d'):  // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('H'):  // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('I'):  // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('M'):  // minutes
            formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('S'):  // seconds
            formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('e'):  // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
            break;

        case ('f'):  // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
            break;

        case ('F'):  // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
            break;

        case ('E'):  // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
            break;

        case ('p'):  // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('r'):  // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('R'):  // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('T'):
        case ('X'):  // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('z'):  // timezone
            formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('P'):  // pid
            formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
            break;

        case ('^'):  // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'):  // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'):  // source location (filename:filenumber)
            formatters_.push_back(
                details::make_unique<details::source_location_formatter<Padder>>(padding));
            break;

        case ('s'):  // short source filename - without directory name
            formatters_.push_back(
                details::make_unique<details::short_filename_formatter<Padder>>(padding));
            break;

        case ('g'):  // full source filename
            formatters_.push_back(
                details::make_unique<details::source_filename_formatter<Padder>>(padding));
            break;

        case ('#'):  // source line number
            formatters_.push_back(
                details::make_unique<details::source_linenum_formatter<Padder>>(padding));
            break;

        case ('!'):  // source funcname
            formatters_.push_back(
                details::make_unique<details::source_funcname_formatter<Padder>>(padding));
            break;

        case ('%'):  // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        case ('u'):  // elapsed time since last log message in nanos
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(
                    padding));
            break;

        case ('i'):  // elapsed time since last log message in micros
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(
                    padding));
            break;

        case ('o'):  // elapsed time since last log message in millis
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(
                    padding));
            break;

        case ('O'):  // elapsed time since last log message in seconds
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(
                    padding));
            break;

#ifndef SPDLOG_NO_TLS  // mdc formatter requires TLS support
        case ('&'):
            formatters_.push_back(details::make_unique<details::mdc_formatter<Padder>>(padding));
            break;
#endif

        default:  // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();

            if (!padding.truncate_) {
                unknown_flag->add_ch('%');
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }
            // fix issue #1617 (prev char was '!' and should have been treated as funcname flag
            // instead of truncating flag) spdlog::set_pattern("[%10!] %v") => "[      main] some
            // message" spdlog::set_pattern("[%3!!] %v") => "[mai] some message"
            else {
                padding.truncate_ = false;
                formatters_.push_back(
                    details::make_unique<details::source_funcname_formatter<Padder>>(padding));
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }

            break;
    }
}